

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlRelaxNGDefinePtr pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict local_40;
  xmlRelaxNGDefinePtr_conflict list_1;
  xmlRelaxNGDefinePtr_conflict list;
  int oldflags;
  int ret;
  xmlNodePtr elem_local;
  xmlRelaxNGDefinePtr_conflict define_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  list._4_4_ = 0;
  list._0_4_ = 0;
  if ((define->name != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(elem->name,define->name), iVar2 == 0)
     ) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMNAME,define->name,elem->name,0);
    return 0;
  }
  if ((define->ns == (xmlChar *)0x0) || (*define->ns == '\0')) {
    if ((elem->ns != (xmlNs *)0x0) &&
       ((define->ns != (xmlChar *)0x0 && (define->name == (xmlChar *)0x0)))) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMEXTRANS,elem->name,(xmlChar *)0x0,0);
      return 0;
    }
    if ((elem->ns != (xmlNs *)0x0) && (define->name != (xmlChar *)0x0)) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMEXTRANS,define->name,(xmlChar *)0x0,0);
      return 0;
    }
  }
  else {
    if (elem->ns == (xmlNs *)0x0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMNONS,elem->name,(xmlChar *)0x0,0);
      return 0;
    }
    iVar2 = xmlStrEqual(elem->ns->href,define->ns);
    if (iVar2 == 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMWRONGNS,elem->name,define->ns,0);
      return 0;
    }
  }
  if (define->nameClass == (xmlRelaxNGDefinePtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else {
    pxVar1 = define->nameClass;
    if (pxVar1->type == XML_RELAXNG_EXCEPT) {
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
        list._0_4_ = ctxt->flags;
        ctxt->flags = ctxt->flags | 1;
      }
      for (list_1 = pxVar1->content; list_1 != (xmlRelaxNGDefinePtr_conflict)0x0;
          list_1 = list_1->next) {
        iVar2 = xmlRelaxNGElementMatch(ctxt,list_1,elem);
        if (iVar2 == 1) {
          if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
            ctxt->flags = (int)list;
          }
          return 0;
        }
        if (iVar2 < 0) {
          if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
            return iVar2;
          }
          ctxt->flags = (int)list;
          return iVar2;
        }
      }
      list._4_4_ = 1;
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
        ctxt->flags = (int)list;
      }
    }
    else if (pxVar1->type == XML_RELAXNG_CHOICE) {
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
        list._0_4_ = ctxt->flags;
        ctxt->flags = ctxt->flags | 1;
      }
      for (local_40 = pxVar1->nameClass; local_40 != (xmlRelaxNGDefinePtr_conflict)0x0;
          local_40 = local_40->next) {
        list._4_4_ = xmlRelaxNGElementMatch(ctxt,local_40,elem);
        if (list._4_4_ == 1) {
          if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
            ctxt->flags = (int)list;
          }
          return 1;
        }
        if (list._4_4_ < 0) {
          if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
            return list._4_4_;
          }
          ctxt->flags = (int)list;
          return list._4_4_;
        }
      }
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
        if (list._4_4_ == 0) {
          if (0 < ctxt->errNr) {
            xmlRelaxNGPopErrors(ctxt,0);
          }
        }
        else if ((ctxt->flags & 1U) == 0) {
          xmlRelaxNGDumpValidError(ctxt);
        }
      }
      list._4_4_ = 0;
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
        ctxt->flags = (int)list;
      }
    }
    else {
      list._4_4_ = -1;
    }
    ctxt_local._4_4_ = list._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        /* TODO */
        ret = -1;
    }
    return (ret);
}